

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t ulocimp_getLanguage_63(char *localeID,char *language,int32_t languageCapacity,char **pEnd)

{
  byte c;
  char cVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  char lang [4];
  
  lang[0] = '\0';
  lang[1] = '\0';
  lang[2] = '\0';
  lang[3] = '\0';
  uVar4 = 0;
  uVar3 = (byte)*localeID - 0x49;
  if ((uVar3 < 0x30) && ((0x800100008001U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    if ((localeID[1] == '_') || (localeID[1] == '-')) {
      if (0 < languageCapacity) {
        cVar1 = uprv_asciitolower_63(*localeID);
        *language = cVar1;
        language[1] = '-';
      }
      localeID = localeID + 2;
      uVar4 = 2;
    }
    else {
      uVar4 = 0;
    }
  }
  while( true ) {
    c = *localeID;
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    if ((long)uVar4 < (long)languageCapacity) {
      cVar1 = uprv_asciitolower_63(c);
      language[uVar4] = cVar1;
    }
    if (uVar4 < 3) {
      cVar1 = uprv_asciitolower_63(*localeID);
      lang[uVar4] = cVar1;
    }
    uVar4 = uVar4 + 1;
    localeID = (char *)((byte *)localeID + 1);
  }
  if (uVar4 == 3) {
    uVar2 = _findIndex(LANGUAGES_3,lang);
    if ((short)uVar2 < 0) {
      uVar4 = 3;
    }
    else {
      uVar3 = _copyCount(language,languageCapacity,LANGUAGES[uVar2]);
      uVar4 = (ulong)uVar3;
    }
  }
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  return (int32_t)uVar4;
}

Assistant:

U_CFUNC int32_t
ulocimp_getLanguage(const char *localeID,
                    char *language, int32_t languageCapacity,
                    const char **pEnd) {
    int32_t i=0;
    int32_t offset;
    char lang[4]={ 0, 0, 0, 0 }; /* temporary buffer to hold language code for searching */

    /* if it starts with i- or x- then copy that prefix */
    if(_isIDPrefix(localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<languageCapacity) {
            language[i+1]='-';
        }
        i+=2;
        localeID+=2;
    }

    /* copy the language as far as possible and count its length */
    while(!_isTerminator(*localeID) && !_isIDSeparator(*localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<3) {
            U_ASSERT(i>=0);
            lang[i]=(char)uprv_tolower(*localeID);
        }
        i++;
        localeID++;
    }

    if(i==3) {
        /* convert 3 character code to 2 character code if possible *CWB*/
        offset=_findIndex(LANGUAGES_3, lang);
        if(offset>=0) {
            i=_copyCount(language, languageCapacity, LANGUAGES[offset]);
        }
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }
    return i;
}